

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O3

int fft3dInit(long L,long M2,long M)

{
  int iVar1;
  float *pfVar2;
  
  if (0x3f < (ulong)L) {
    return 1;
  }
  if (Array2d[L] == (float *)0x0) {
    pfVar2 = (float *)malloc(0x20L << (L & 0x3fU));
    Array2d[L] = pfVar2;
    if (pfVar2 == (float *)0x0) {
      return 2;
    }
    iVar1 = fftInit(L);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  if (Array2d[M2] == (float *)0x0) {
    pfVar2 = (float *)malloc(0x20L << (M2 & 0x3fU));
    Array2d[M2] = pfVar2;
    if (pfVar2 == (float *)0x0) {
      return 2;
    }
    iVar1 = fftInit(M2);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = fftInit(M);
  return iVar1;
}

Assistant:

int fft3dInit(long L, long M2, long M){
	// init for fft3d, ifft3d
	// malloc storage for 4 columns and 4 pages of 3d ffts
	// then call fftinit for page, row and column ffts sizes
//* M = log2 of number of columns */
/* M2 = log2 of number of rows */
/* L = log2 of number of pages */
/*       of 3d matrix to be fourier transformed */
/* OUTPUTS */
/* private storage for columns and pages of 3d ffts	*/
/* calls fftInit for cosine and bit reversed tables	*/
int theError = 1;
if ((L >= 0) && (L < 8*sizeof(long))){
	theError = 0;
	if (Array2d[L] == 0){
		Array2d[L] = (float *) malloc( 4*2*POW2(L)*sizeof(float) );
		if (Array2d[L] == 0)
			theError = 2;
		else{
			theError = fftInit(L);
		}
	}
	if (theError == 0){
		if (Array2d[M2] == 0){
			Array2d[M2] = (float *) malloc( 4*2*POW2(M2)*sizeof(float) );
			if (Array2d[M2] == 0)
				theError = 2;
			else{
				theError = fftInit(M2);
			}
		}
	}
	if (theError == 0)
		theError = fftInit(M);
}
return theError;
}